

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dist.c
# Opt level: O1

REF_STATUS
ref_dist_collisions(REF_GRID ref_grid,REF_BOOL report,char *filename,REF_INT *n_collisions)

{
  uint uVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar2;
  bool bVar3;
  uint uVar4;
  REF_STATUS RVar5;
  uint uVar6;
  FILE *__s;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  int cell;
  double dVar12;
  REF_LIST collision_node;
  REF_LIST collision_faceid;
  REF_LIST ref_list;
  REF_EDGE ref_edge;
  REF_SEARCH ref_search;
  REF_DBL center [3];
  REF_DBL side1;
  REF_DBL side0;
  REF_DBL vol1;
  REF_DBL vol0;
  REF_INT nodes [27];
  REF_INT tet_nodes [27];
  double local_1b8;
  REF_LIST local_1a0;
  double local_198;
  REF_LIST local_190;
  REF_LIST local_188;
  REF_EDGE local_180;
  REF_SEARCH local_178;
  REF_BOOL local_16c;
  double local_168 [3];
  long local_150;
  long local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  uint local_118 [28];
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint local_9c;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *n_collisions = 0;
  uVar4 = ref_edge_create(&local_180,ref_grid);
  if (uVar4 != 0) {
    pcVar11 = "create edge";
    uVar8 = 0x80;
    goto LAB_00141690;
  }
  uVar4 = ref_search_create(&local_178,ref_cell->n);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0x81,
           "ref_dist_collisions",(ulong)uVar4,"create search");
    return uVar4;
  }
  if (0 < ref_cell->max) {
    cell = 0;
    local_1b8 = local_198;
    do {
      RVar5 = ref_cell_nodes(ref_cell,cell,(REF_INT *)local_118);
      if (RVar5 == 0) {
        pRVar2 = ref_node->real;
        lVar9 = 0;
        do {
          local_168[lVar9] =
               (pRVar2[(long)(int)local_118[0] * 0xf + lVar9] +
                pRVar2[(long)(int)local_118[1] * 0xf + lVar9] +
               pRVar2[(long)(int)local_118[2] * 0xf + lVar9]) * 0.3333333333333333;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        local_1b8 = 0.0;
        lVar9 = 0;
        do {
          pRVar2 = ref_node->real;
          lVar7 = (long)(int)local_118[lVar9];
          dVar12 = (pRVar2[lVar7 * 0xf + 2] - local_168[2]) *
                   (pRVar2[lVar7 * 0xf + 2] - local_168[2]) +
                   (pRVar2[lVar7 * 0xf + 1] - local_168[1]) *
                   (pRVar2[lVar7 * 0xf + 1] - local_168[1]) +
                   (pRVar2[lVar7 * 0xf] - local_168[0]) * (pRVar2[lVar7 * 0xf] - local_168[0]);
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          if (local_1b8 <= dVar12) {
            pRVar2 = ref_node->real;
            lVar7 = (long)(int)local_118[lVar9];
            local_1b8 = (pRVar2[lVar7 * 0xf + 2] - local_168[2]) *
                        (pRVar2[lVar7 * 0xf + 2] - local_168[2]) +
                        (pRVar2[lVar7 * 0xf + 1] - local_168[1]) *
                        (pRVar2[lVar7 * 0xf + 1] - local_168[1]) +
                        (pRVar2[lVar7 * 0xf] - local_168[0]) * (pRVar2[lVar7 * 0xf] - local_168[0]);
            if (local_1b8 < 0.0) {
              local_1b8 = sqrt(local_1b8);
            }
            else {
              local_1b8 = SQRT(local_1b8);
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        uVar4 = ref_search_insert(local_178,cell,local_168,local_1b8 * 1.01);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",
                 0x84,"ref_dist_collisions",(ulong)uVar4,"insert");
          return uVar4;
        }
      }
      cell = cell + 1;
      local_198 = local_1b8;
    } while (cell < ref_cell->max);
  }
  uVar4 = ref_list_create(&local_1a0);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0x87,
           "ref_dist_collisions",(ulong)uVar4,"create node list");
    return uVar4;
  }
  uVar4 = ref_list_create(&local_190);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0x88,
           "ref_dist_collisions",(ulong)uVar4,"create faceid list");
    return uVar4;
  }
  uVar4 = ref_list_create(&local_188);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0x89,
           "ref_dist_collisions",(ulong)uVar4,"create list");
    return uVar4;
  }
  if (0 < local_180->n) {
    lVar9 = 0;
    local_16c = report;
    do {
      local_150 = lVar9;
      ref_dist_bounding_sphere2
                (ref_node,local_180->e2n[lVar9 * 2],local_180->e2n[lVar9 * 2 + 1],local_168,
                 &local_198);
      uVar4 = ref_search_touching(local_178,local_188,local_168,local_198 * 1.01);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0x91
               ,"ref_dist_collisions",(ulong)uVar4,"touch");
        return uVar4;
      }
      if (0 < local_188->n) {
        local_148 = local_150 * 2 + 1;
        lVar7 = 0;
        do {
          uVar4 = ref_cell_nodes(ref_cell,local_188->value[lVar7],(REF_INT *)local_118);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",
                   0x94,"ref_dist_collisions",(ulong)uVar4,"cell nodes");
            return uVar4;
          }
          uVar4 = local_180->e2n[lVar9 * 2];
          uVar1 = local_180->e2n[local_148];
          if (((local_118[0] != uVar4) || (local_118[1] != uVar1)) &&
             ((local_118[1] != uVar4 || (local_118[2] != uVar1)))) {
            if (((local_118[0] != uVar1 || local_118[1] != uVar4) &&
                (local_118[0] != uVar1 && local_118[1] != uVar1 || local_118[2] != uVar4)) &&
               (local_118[2] != uVar1 || local_118[0] != uVar4)) {
              local_a8 = local_118[0];
              uStack_a4 = local_118[1];
              uStack_a0 = local_118[2];
              local_9c = uVar4;
              uVar6 = ref_node_tet_vol(ref_node,(REF_INT *)&local_a8,&local_120);
              if (uVar6 == 0) {
                local_9c = uVar1;
                uVar6 = ref_node_tet_vol(ref_node,(REF_INT *)&local_a8,&local_128);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                         ,0x37,"ref_dist_pierce",(ulong)uVar6,"vol1");
                  uVar10 = (ulong)uVar6;
                  goto LAB_00141cc4;
                }
                if (((0.0 < local_120) && (uVar10 = 0, 0.0 < local_128)) ||
                   ((local_120 < 0.0 && (uVar10 = 0, local_128 < 0.0)))) goto LAB_00141cc4;
                local_a8 = local_118[1];
                uStack_a4 = local_118[2];
                uStack_a0 = uVar4;
                local_9c = uVar1;
                uVar4 = ref_node_tet_vol(ref_node,(REF_INT *)&local_a8,&local_130);
                if (uVar4 == 0) {
                  local_a8 = local_118[2];
                  uStack_a4 = local_118[0];
                  uVar4 = ref_node_tet_vol(ref_node,(REF_INT *)&local_a8,&local_138);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                           ,0x43,"ref_dist_pierce",(ulong)uVar4,"side1");
                    goto LAB_00141ef4;
                  }
                  local_a8 = local_118[0];
                  uStack_a4 = local_118[1];
                  uVar4 = ref_node_tet_vol(ref_node,(REF_INT *)&local_a8,&local_140);
                  if (uVar4 == 0) {
                    if (((local_130 <= 0.0) || (local_138 <= 0.0)) || (local_140 <= 0.0)) {
                      if ((local_130 < 0.0) && (local_138 < 0.0)) {
                        bVar3 = true;
                        uVar10 = 0;
                        if (0.0 <= local_140) goto LAB_00141cc9;
                        goto LAB_00142000;
                      }
                      bVar3 = true;
                    }
                    else {
LAB_00142000:
                      bVar3 = false;
                    }
                    uVar10 = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                           ,0x46,"ref_dist_pierce",(ulong)uVar4,"side2");
                    uVar10 = (ulong)uVar4;
                    bVar3 = true;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                         ,0x40,"ref_dist_pierce",(ulong)uVar4,"side0");
LAB_00141ef4:
                  uVar10 = (ulong)uVar4;
                  bVar3 = true;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0x35,"ref_dist_pierce",(ulong)uVar6,"vol0");
                uVar10 = (ulong)uVar6;
LAB_00141cc4:
                bVar3 = true;
              }
LAB_00141cc9:
              if ((int)uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0x9a,"ref_dist_collisions",uVar10,"hits?");
                return (int)uVar10;
              }
              if (!bVar3) {
                uVar4 = ref_list_push(local_1a0,local_118[0]);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                         ,0x9c,"ref_dist_collisions",(ulong)uVar4,"push node");
                  return uVar4;
                }
                uVar4 = ref_list_push(local_190,local_118[ref_cell->node_per]);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                         ,0x9e,"ref_dist_collisions",(ulong)uVar4,"push faceid");
                  return uVar4;
                }
                *n_collisions = *n_collisions + 1;
                if (local_16c != 0) {
                  printf("%f %f %f # self intersection of face %d\n",
                         ref_node->real[(long)(int)local_118[0] * 0xf],
                         ref_node->real[(long)(int)local_118[0] * 0xf + 1],
                         (ulong)local_118[ref_cell->node_per]);
                }
              }
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_188->n);
      }
      uVar4 = ref_list_erase(local_188);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0xa9
               ,"ref_dist_collisions",(ulong)uVar4,"erase");
        return uVar4;
      }
      lVar9 = local_150 + 1;
    } while (lVar9 < local_180->n);
  }
  if ((filename != (char *)0x0) && (0 < *n_collisions)) {
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      bVar3 = false;
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0xb1,
             "ref_dist_collisions","unable to open file");
      RVar5 = 2;
    }
    else {
      fwrite("title=\"tecplot refine surface self intersections\"\n",0x32,1,__s);
      fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
      if (*n_collisions == local_1a0->n) {
        if (*n_collisions == local_190->n) {
          fprintf(__s,"zone t=\"intersect\", i=%d, datapacking=%s\n",(ulong)(uint)*n_collisions,
                  "point");
          if (0 < local_1a0->n) {
            lVar9 = 0;
            do {
              lVar7 = (long)local_1a0->value[lVar9];
              pRVar2 = ref_node->real;
              fprintf(__s,"# intersection %d face id\n%f %f %f\n",pRVar2[lVar7 * 0xf],
                      pRVar2[lVar7 * 0xf + 1],pRVar2[lVar7 * 0xf + 2],
                      (ulong)(uint)local_190->value[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar9 < local_1a0->n);
          }
          fclose(__s);
          bVar3 = true;
          RVar5 = 0;
          goto LAB_0014227d;
        }
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0xb5
               ,"ref_dist_collisions","faceid miscount",(long)*n_collisions,(long)local_190->n);
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0xb4
               ,"ref_dist_collisions","node miscount",(long)*n_collisions,(long)local_1a0->n);
      }
      RVar5 = 1;
      bVar3 = false;
    }
LAB_0014227d:
    if (!bVar3) {
      return RVar5;
    }
  }
  uVar4 = ref_list_free(local_188);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0xc3,
           "ref_dist_collisions",(ulong)uVar4,"free");
    return uVar4;
  }
  uVar4 = ref_list_free(local_190);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0xc4,
           "ref_dist_collisions",(ulong)uVar4,"free");
    return uVar4;
  }
  uVar4 = ref_list_free(local_1a0);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0xc5,
           "ref_dist_collisions",(ulong)uVar4,"free");
    return uVar4;
  }
  uVar4 = ref_search_free(local_178);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0xc6,
           "ref_dist_collisions",(ulong)uVar4,"free");
    return uVar4;
  }
  uVar4 = ref_edge_free(local_180);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar11 = "free";
  uVar8 = 199;
LAB_00141690:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",uVar8,
         "ref_dist_collisions",(ulong)uVar4,pcVar11);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_dist_collisions(REF_GRID ref_grid, REF_BOOL report,
                                       const char *filename,
                                       REF_INT *n_collisions) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_INT item;
  REF_INT edge;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, scale = 1.01;
  REF_BOOL pierce;
  REF_SEARCH ref_search;
  REF_LIST ref_list, collision_node, collision_faceid;

  *n_collisions = 0;

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_search_create(&ref_search, ref_cell_n(ref_cell)), "create search");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dist_bounding_sphere3(ref_node, nodes, center, &radius), "b");
    RSS(ref_search_insert(ref_search, cell, center, scale * radius), "insert");
  }

  RSS(ref_list_create(&collision_node), "create node list");
  RSS(ref_list_create(&collision_faceid), "create faceid list");
  RSS(ref_list_create(&ref_list), "create list");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_dist_bounding_sphere2(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                  ref_edge_e2n(ref_edge, 1, edge), center,
                                  &radius),
        "b");
    RSS(ref_search_touching(ref_search, ref_list, center, scale * radius),
        "touch");
    each_ref_list_item(ref_list, item) {
      cell = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      if (ref_dist_exclude(ref_edge_e2n(ref_edge, 0, edge),
                           ref_edge_e2n(ref_edge, 1, edge), nodes))
        continue;
      RSS(ref_dist_pierce(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                          ref_edge_e2n(ref_edge, 1, edge), nodes, &pierce),
          "hits?");
      if (pierce) {
        RSS(ref_list_push(collision_node, nodes[0]), "push node");
        RSS(ref_list_push(collision_faceid, nodes[ref_cell_id_index(ref_cell)]),
            "push faceid");
        (*n_collisions) += 1;
        if (report) {
          printf("%f %f %f # self intersection of face %d\n",
                 ref_node_xyz(ref_node, 0, nodes[0]),
                 ref_node_xyz(ref_node, 1, nodes[0]),
                 ref_node_xyz(ref_node, 2, nodes[0]),
                 nodes[ref_cell_id_index(ref_cell)]);
        }
      }
    }
    RSS(ref_list_erase(ref_list), "erase");
  }

  if (NULL != filename && (*n_collisions) > 0) {
    FILE *file;
    REF_INT faceid, node;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine surface self intersections\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");
    REIS(*n_collisions, ref_list_n(collision_node), "node miscount");
    REIS(*n_collisions, ref_list_n(collision_faceid), "faceid miscount");
    fprintf(file, "zone t=\"intersect\", i=%d, datapacking=%s\n", *n_collisions,
            "point");
    each_ref_list_item(collision_node, item) {
      node = ref_list_value(collision_node, item);
      faceid = ref_list_value(collision_faceid, item);
      fprintf(file, "# intersection %d face id\n%f %f %f\n", faceid,
              ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
              ref_node_xyz(ref_node, 2, node));
    }

    fclose(file);
  }

  RSS(ref_list_free(ref_list), "free");
  RSS(ref_list_free(collision_faceid), "free");
  RSS(ref_list_free(collision_node), "free");
  RSS(ref_search_free(ref_search), "free");
  RSS(ref_edge_free(ref_edge), "free");

  return REF_SUCCESS;
}